

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void udp_rx_cb(void *arg)

{
  nni_mtx *mtx;
  nng_sockaddr *sa;
  nni_lmq *lmq;
  byte bVar1;
  char *pcVar2;
  nni_msg *m;
  udp_pipe *msg;
  _Bool _Var3;
  uint16_t uVar4;
  nng_err nVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  udp_pipe *puVar9;
  nni_aio *pnVar10;
  nni_time nVar11;
  void *__dest;
  void *__src;
  uint32_t uVar12;
  nng_duration nVar13;
  uint32_t self_id;
  udp_disc_reason uVar14;
  ulong size;
  udp_pipe *local_38;
  nni_aio_completions complq;
  
  pnVar10 = (nni_aio *)((long)arg + 0x658);
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  nVar5 = nni_aio_result(pnVar10);
  if (nVar5 != NNG_OK) {
    nVar5 = nni_aio_result(pnVar10);
    switch(nVar5) {
    case NNG_EINTR:
    case NNG_ETIMEDOUT:
    case NNG_EAGAIN:
      goto switchD_00128b18_caseD_1;
    default:
      if ((nVar5 == NNG_ESTOPPED) || (nVar5 == NNG_ECANCELED)) goto switchD_00128b18_caseD_7;
    case NNG_ENOMEM:
    case NNG_EINVAL:
    case NNG_EBUSY:
    case NNG_ECONNREFUSED:
      *(undefined1 *)((long)arg + 0x37) = 1;
      nni_sleep_aio(5,pnVar10);
    case NNG_ECLOSED:
switchD_00128b18_caseD_7:
      nni_mtx_unlock(mtx);
      return;
    }
  }
  if (*(char *)((long)arg + 0x37) == '\x01') goto switchD_00128b18_caseD_1;
  pcVar2 = *(char **)((long)arg + 0xa28);
  sVar8 = nng_aio_count(pnVar10);
  if ((sVar8 < 0x14) || (*pcVar2 != '\x01')) goto LAB_00128b26;
  sa = (nng_sockaddr *)((long)arg + 0x408);
  switch(pcVar2[1]) {
  case '\0':
    self_id = *(uint32_t *)(pcVar2 + 4);
    uVar12 = *(uint32_t *)(pcVar2 + 8);
    puVar9 = udp_find_pipe((udp_ep *)arg,uVar12,self_id);
    if (puVar9 != (udp_pipe *)0x0) {
      if (puVar9->peer_id == 0) {
        nni_stat_inc((nni_stat_item *)((long)arg + 0xb38),1);
        udp_send_creq((udp_ep *)arg,puVar9);
        goto LAB_00128b26;
      }
      size = sVar8 - 0x14;
      nVar11 = nni_clock();
      if ((size < *(ushort *)(pcVar2 + 0x10)) || (puVar9->rcvmax < *(ushort *)(pcVar2 + 0x10))) {
        nni_stat_inc((nni_stat_item *)((long)arg + 0xaf8),1);
        uVar14 = DISC_MSGSIZE;
        goto LAB_00128fe3;
      }
      puVar9->expire = (long)puVar9->refresh * 5 + nVar11;
      puVar9->next_wake = nVar11 + (long)puVar9->refresh;
      udp_pipe_schedule(puVar9);
      m = *(nni_msg **)((long)arg + 0x400);
      sVar8 = nni_msg_len(m);
      nni_msg_chop(m,sVar8 - *(ushort *)(pcVar2 + 0x10));
      uVar12 = *(uint32_t *)(pcVar2 + 0xc);
      if ((int)(uVar12 - puVar9->peer_seq) < 0) {
        nni_stat_inc(&puVar9->ep->st_rcv_reorder,1);
        goto LAB_00128b26;
      }
      if (uVar12 != puVar9->peer_seq) {
        nni_stat_inc(&puVar9->ep->st_rcv_reorder,1);
      }
      puVar9->peer_seq = uVar12 + 1;
      lmq = &puVar9->rx_mq;
      _Var3 = nni_lmq_full(lmq);
      if (_Var3) {
        nni_lmq_get(lmq,(nng_msg **)&local_38);
        nni_msg_free((nni_msg *)local_38);
        nni_stat_inc((nni_stat_item *)((long)arg + 0xbf8),1);
      }
      if (*(ushort *)((long)arg + 0xa32) < size) {
        nni_stat_inc((nni_stat_item *)((long)arg + 3000),1);
        local_38 = *(udp_pipe **)((long)arg + 0x400);
        iVar7 = nng_msg_alloc((nng_msg **)((long)arg + 0x400),(ulong)*(ushort *)((long)arg + 0xa30))
        ;
        if (iVar7 == 0) {
          sVar8 = nng_msg_len((nng_msg *)local_38);
          msg = local_38;
          if (sVar8 < size) {
            sVar8 = nng_msg_len((nng_msg *)local_38);
            nng_msg_chop((nng_msg *)msg,sVar8 - size);
          }
          nni_msg_set_address((nng_msg *)local_38,sa);
          nni_lmq_put(lmq,(nng_msg *)local_38);
LAB_0012919a:
          while ((pnVar10 = (nni_aio *)nni_list_first(&puVar9->rx_aios), pnVar10 != (nni_aio *)0x0
                 && (_Var3 = nni_lmq_empty(lmq), !_Var3))) {
            nni_aio_list_remove(pnVar10);
            nni_lmq_get(lmq,(nng_msg **)&local_38);
            nni_aio_set_msg(pnVar10,(nni_msg *)local_38);
            sVar8 = nni_aio_count(pnVar10);
            nni_aio_completions_add((nni_aio_completions *)((long)arg + 0xa50),pnVar10,NNG_OK,sVar8)
            ;
          }
          goto LAB_00128b26;
        }
        *(nng_msg **)((long)arg + 0x400) = (nng_msg *)local_38;
      }
      else {
        nni_stat_inc((nni_stat_item *)((long)arg + 0xb78),1);
        iVar7 = nng_msg_alloc((nng_msg **)&local_38,size);
        if (iVar7 == 0) {
          nni_msg_set_address((nng_msg *)local_38,sa);
          __dest = nni_msg_body((nni_msg *)local_38);
          __src = nni_msg_body(*(nni_msg **)((long)arg + 0x400));
          memcpy(__dest,__src,size);
          nni_lmq_put(lmq,(nng_msg *)local_38);
          nni_msg_realloc(*(nni_msg **)((long)arg + 0x400),(ulong)*(ushort *)((long)arg + 0xa30));
          goto LAB_0012919a;
        }
      }
      if (puVar9->npipe != (nni_pipe *)0x0) {
        nni_pipe_bump_error(puVar9->npipe,2);
      }
      goto LAB_00128b26;
    }
    nni_stat_inc((nni_stat_item *)((long)arg + 0xb38),1);
    uVar14 = DISC_NOTCONN;
    break;
  case '\x01':
    nVar11 = nni_clock();
    uVar12 = *(uint32_t *)(pcVar2 + 4);
    self_id = *(uint32_t *)(pcVar2 + 8);
    if (*(char *)((long)arg + 1000) != '\x01') {
      puVar9 = udp_find_pipe((udp_ep *)arg,self_id,uVar12);
      local_38 = puVar9;
      if (puVar9 != (udp_pipe *)0x0) {
        if ((puVar9->peer_id == 0) || (puVar9->peer != *(uint16_t *)(pcVar2 + 2)))
        goto LAB_00128b26;
        if (pcVar2[0x13] != 0) {
          iVar6 = (uint)(byte)pcVar2[0x13] * 1000;
          iVar7 = puVar9->refresh;
          if (iVar6 < puVar9->refresh) {
            puVar9->refresh = iVar6;
            iVar7 = iVar6;
          }
          puVar9->next_wake = nVar11 + (long)iVar7;
          puVar9->expire = (long)(iVar7 * 5) + nVar11;
          udp_pipe_schedule(puVar9);
          udp_send_cack((udp_ep *)arg,puVar9);
          goto LAB_00128b26;
        }
        uVar14 = DISC_NEGO;
        goto LAB_00128fe3;
      }
      if ((*(char *)((long)arg + 0x34) == '\0') && (*(char *)((long)arg + 0x36) != '\x01')) {
        if (pcVar2[0x13] == '\0') {
          uVar12 = *(uint32_t *)(pcVar2 + 4);
          uVar14 = DISC_NEGO;
        }
        else {
          iVar7 = nni_pipe_alloc_listener(&local_38,*(nni_listener **)((long)arg + 0x3f0));
          if (iVar7 == 0) {
            iVar7 = udp_pipe_start(local_38,(udp_ep *)arg,sa);
            if (iVar7 != 0) {
              udp_send_disc_full((udp_ep *)arg,sa,0,*(uint32_t *)(pcVar2 + 4),0,DISC_NOBUF);
              nni_pipe_close(local_38->npipe);
              goto LAB_00128b26;
            }
            iVar6 = (uint)(byte)pcVar2[0x13] * 1000;
            iVar7 = local_38->refresh;
            if (iVar6 < local_38->refresh) {
              local_38->refresh = iVar6;
              iVar7 = iVar6;
            }
            local_38->peer = *(uint16_t *)(pcVar2 + 2);
            local_38->peer_id = *(uint32_t *)(pcVar2 + 4);
            local_38->peer_seq = *(int *)(pcVar2 + 0xc) + 1;
            local_38->sndmax = *(uint16_t *)(pcVar2 + 0x10);
            local_38->next_wake = nVar11 + (long)iVar7;
            udp_pipe_schedule(local_38);
            nni_list_append((nni_list *)((long)arg + 0xa08),local_38);
            udp_send_cack((udp_ep *)arg,local_38);
            goto LAB_0012905f;
          }
          uVar12 = *(uint32_t *)(pcVar2 + 4);
          uVar14 = DISC_NOBUF;
        }
      }
      else {
        uVar12 = *(uint32_t *)(pcVar2 + 4);
        uVar14 = DISC_REFUSED;
      }
      goto LAB_00128d31;
    }
    uVar14 = DISC_REFUSED;
    break;
  case '\x02':
    puVar9 = udp_find_pipe((udp_ep *)arg,*(uint32_t *)(pcVar2 + 8),*(uint32_t *)(pcVar2 + 4));
    if ((puVar9 != (udp_pipe *)0x0) && (puVar9->closed == false)) {
      uVar12 = puVar9->peer_id;
      if (uVar12 == 0) {
        uVar4 = *(uint16_t *)(pcVar2 + 2);
      }
      else {
        uVar4 = puVar9->peer;
        if (uVar4 != *(uint16_t *)(pcVar2 + 2)) {
          uVar14 = DISC_TYPE;
          goto LAB_00128fe3;
        }
      }
      puVar9->sndmax = *(uint16_t *)(pcVar2 + 0x10);
      puVar9->peer = uVar4;
      puVar9->peer_id = *(uint32_t *)(pcVar2 + 4);
      bVar1 = pcVar2[0x13];
      if (bVar1 != 0) {
        if (uVar12 == 0) {
          nVar13 = *(nng_duration *)((long)arg + 0xa20);
          puVar9->refresh = nVar13;
          puVar9->peer_seq = *(int *)(pcVar2 + 0xc) + 1;
        }
        else {
          nVar13 = puVar9->refresh;
        }
        iVar7 = (uint)bVar1 * 1000;
        if (iVar7 < nVar13) {
          puVar9->refresh = iVar7;
        }
        nVar11 = nni_clock();
        puVar9->next_wake = nVar11 + (long)puVar9->refresh;
        puVar9->expire = (long)puVar9->refresh * 5 + nVar11;
        udp_pipe_schedule(puVar9);
        if (uVar12 != 0) goto LAB_00128b26;
        nni_list_append((nni_list *)((long)arg + 0xa08),puVar9);
LAB_0012905f:
        udp_ep_match((udp_ep *)arg);
        goto LAB_00128b26;
      }
      uVar14 = DISC_NEGO;
LAB_00128fe3:
      udp_send_disc((udp_ep *)arg,puVar9,uVar14);
      goto LAB_00128b26;
    }
    uVar12 = *(uint32_t *)(pcVar2 + 4);
    self_id = *(uint32_t *)(pcVar2 + 8);
    uVar14 = DISC_NOTCONN;
    break;
  case '\x03':
    puVar9 = udp_find_pipe((udp_ep *)arg,*(uint32_t *)(pcVar2 + 8),*(uint32_t *)(pcVar2 + 4));
    if (puVar9 != (udp_pipe *)0x0) {
      puVar9->closed = true;
      while (pnVar10 = (nni_aio *)nni_list_first(&puVar9->rx_aios), pnVar10 != (nni_aio *)0x0) {
        nni_aio_list_remove(pnVar10);
        nni_aio_finish_error(pnVar10,NNG_ECLOSED);
      }
    }
    goto LAB_00128b26;
  default:
    uVar12 = *(uint32_t *)(pcVar2 + 4);
    uVar14 = DISC_PROTO;
LAB_00128d31:
    self_id = 0;
  }
  udp_send_disc_full((udp_ep *)arg,sa,self_id,uVar12,0,uVar14);
LAB_00128b26:
  udp_start_rx((udp_ep *)arg);
  local_38 = *(udp_pipe **)((long)arg + 0xa50);
  nni_aio_completions_init((nni_aio_completions *)((long)arg + 0xa50));
  nni_mtx_unlock(mtx);
  nni_aio_completions_run(&local_38);
  return;
switchD_00128b18_caseD_1:
  *(undefined1 *)((long)arg + 0x37) = 0;
  goto LAB_00128b26;
}

Assistant:

static void
udp_rx_cb(void *arg)
{
	udp_ep             *ep  = arg;
	nni_aio            *aio = &ep->rx_aio;
	int                 rv;
	size_t              n;
	udp_sp_msg         *hdr;
	nng_sockaddr       *sa;
	nni_aio_completions complq;

	// for a received packet we are either receiving it for a
	// connection we already have established, or for a new connection.
	// Dialers cannot receive connection requests (as a safety
	// precaution).

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		// something bad happened on RX... which is unexpected.
		// sleep a little bit and hope for recovery.
		switch (nni_aio_result(aio)) {
		case NNG_ECLOSED:
		case NNG_ECANCELED:
		case NNG_ESTOPPED:
			nni_mtx_unlock(&ep->mtx);
			return;
		case NNG_ETIMEDOUT:
		case NNG_EAGAIN:
		case NNG_EINTR:
			ep->cooldown = false;
			goto finish;
			break;
		default:
			ep->cooldown = true;
			nni_sleep_aio(5, aio);
			nni_mtx_unlock(&ep->mtx);
			return;
		}
	}
	if (ep->cooldown) {
		ep->cooldown = false;
		goto finish;
	}

	// Received message will be in the ep rx header.
	hdr = ep->rx_msg;
	sa  = &ep->rx_sa;
	n   = nng_aio_count(aio);

	if ((n >= sizeof(*hdr)) && (hdr->data.us_ver == 1)) {
		n -= sizeof(*hdr);

#ifndef NNG_LITTLE_ENDIAN
		// Fix the endianness, so other routines don't have to.
		// It turns out that the endianness of the fields of CREQ
		// is compatible with the fields of every other message type.
		// We only have to do this for systems that are not known
		// (at compile time) to be little endian.
		hdr->data.us_type      = NNI_GET16LE(&hdr->data.us_type);
		hdr->data.us_sender_id = NNI_GET32LE(&hdr->data.us_sender_id);
		hdr->data.us_peeer_id  = NNI_GET32LE(&hdr->data.us_peer_id);
		hdr->data.us_sequence  = NNI_GET32LE(&hdr->data.us_sequence);
		hdr->data.us_length    = NNI_GET16LE(&hdr->data.us_length);
#endif

		switch (hdr->data.us_op_code) {
		case OPCODE_DATA:
			udp_recv_data(ep, &hdr->data, n, sa);
			break;
		case OPCODE_CREQ:
			udp_recv_creq(ep, &hdr->creq, sa);
			break;
		case OPCODE_CACK:
			udp_recv_cack(ep, &hdr->cack, sa);
			break;
		case OPCODE_DISC:
			udp_recv_disc(ep, &hdr->disc, sa);
			break;
		case OPCODE_MESH: // TODO:
		                  // udp_recv_mesh(ep, &hdr->mesh, sa);
		                  // break;
		default:
			udp_send_disc_full(
			    ep, sa, 0, hdr->data.us_sender_id, 0, DISC_PROTO);
			break;
		}
	}

finish:
	// start another receive
	udp_start_rx(ep);

	// grab the list of completions so we can finish them.
	complq = ep->complq;
	nni_aio_completions_init(&ep->complq);
	nni_mtx_unlock(&ep->mtx);

	// now run the completions -- synchronously
	nni_aio_completions_run(&complq);
}